

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::SstReader::BeginStep(SstReader *this,StepMode Mode,float timeout_sec)

{
  SstStream p_Var1;
  long lVar2;
  _SstData *p_Var3;
  IO *pIVar4;
  SstStatusValue SVar5;
  int iVar6;
  SstFullMetadata p_Var7;
  BP5Deserializer *pBVar8;
  size_t sVar9;
  SstMetaMetaList __ptr;
  BP3Deserializer *pBVar10;
  SstBlock p_Var11;
  undefined8 uVar12;
  StepStatus SVar13;
  size_t *psVar14;
  int i;
  char **ppcVar15;
  allocator local_15c;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  MetaMetaInfoBlock MM;
  ScopedTimer __var2293;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((BeginStep(adios2::StepMode,float)::__var293 == '\0') &&
     (iVar6 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var293), iVar6 != 0)) {
    uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/sst/SstReader.cpp"
                                 ,
                                 "virtual StepStatus adios2::core::engine::SstReader::BeginStep(StepMode, const float)"
                                 ,0x125);
    BeginStep::__var293 = (void *)ps_timer_create_(uVar12);
    __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var293);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2293,BeginStep::__var293);
  if ((this->super_Engine).m_BetweenStepPairs == true) {
    std::__cxx11::string::string((string *)&MM,"Engine",&local_159);
    std::__cxx11::string::string((string *)&local_128,"SstReader",&local_15a);
    std::__cxx11::string::string((string *)&local_108,"BeginStep",&local_15b);
    std::__cxx11::string::string
              ((string *)&local_e8,
               "BeginStep() is called a second time without an intervening EndStep()",&local_15c);
    helper::Throw<std::logic_error>((string *)&MM,&local_128,&local_108,&local_e8,-1);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&MM);
  }
  if (Mode < Read) {
    std::__cxx11::string::string((string *)&MM,"Engine",&local_159);
    std::__cxx11::string::string((string *)&local_128,"SstReader",&local_15a);
    std::__cxx11::string::string((string *)&local_108,"BeginStep",&local_15b);
    std::__cxx11::string::string
              ((string *)&local_e8,"SstReader::BeginStep inappropriate StepMode specified",
               &local_15c);
    helper::Throw<std::invalid_argument>((string *)&MM,&local_128,&local_108,&local_e8,-1);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&MM);
  }
  Engine::RemoveCreatedVars(&this->super_Engine);
  SVar5 = SstAdvanceStep(this->m_Input,timeout_sec);
  if (SVar5 == SstSuccess) {
    (this->super_Engine).m_BetweenStepPairs = true;
    SVar13 = OK;
    if (this->m_WriterMarshalMethod == SstMarshalBP) {
      if ((BeginStep(adios2::StepMode,float)::__var379 == '\0') &&
         (iVar6 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var379), iVar6 != 0)) {
        BeginStep::__var379 =
             (void *)ps_timer_create_("BP Marshaling Case - deserialize and install metadata");
        __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var379);
      }
      external::perfstubs_profiler::ScopedTimer::ScopedTimer((ScopedTimer *)&MM,BeginStep::__var379)
      ;
      p_Var7 = SstGetCurMetadata(this->m_Input);
      this->m_CurrentStepMetaData = p_Var7;
      pBVar10 = (BP3Deserializer *)operator_new(0x490);
      adios2::format::BP3Deserializer::BP3Deserializer(pBVar10,&(this->super_Engine).m_Comm);
      this->m_BP3Deserializer = pBVar10;
      lVar2 = *(long *)(*(long *)pBVar10 + -0x18);
      pIVar4 = (this->super_Engine).m_IO;
      std::__cxx11::string::string
                ((string *)&local_68,"in call to BP3::Open for reading",(allocator *)&local_128);
      std::__cxx11::string::string((string *)&local_88,"sst",(allocator *)&local_108);
      adios2::format::BPBase::Init
                ((BPBase *)(&pBVar10->field_0x0 + lVar2),&pIVar4->m_Parameters,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      pBVar10 = this->m_BP3Deserializer;
      lVar2 = *(long *)(*(long *)pBVar10 + -0x18);
      sVar9 = (*this->m_CurrentStepMetaData->WriterMetadata)->DataSize;
      std::__cxx11::string::string
                ((string *)&local_a8,"in SST Streaming Listener",(allocator *)&local_128);
      adios2::format::BufferSTL::Resize((BufferSTL *)(&pBVar10->field_0x88 + lVar2),sVar9,&local_a8)
      ;
      std::__cxx11::string::~string((string *)&local_a8);
      p_Var3 = *this->m_CurrentStepMetaData->WriterMetadata;
      memcpy(*(void **)(&this->m_BP3Deserializer->field_0xc8 +
                       *(long *)(*(long *)this->m_BP3Deserializer + -0x18)),p_Var3->block,
             p_Var3->DataSize);
      Engine::RemoveCreatedVars(&this->super_Engine);
      pBVar10 = this->m_BP3Deserializer;
      adios2::format::BP3Deserializer::ParseMetadata
                (pBVar10,(BufferSTL *)(&pBVar10->field_0x88 + *(long *)(*(long *)pBVar10 + -0x18)),
                 &this->super_Engine);
      pIVar4 = (this->super_Engine).m_IO;
      std::__cxx11::string::string
                ((string *)&local_c8,"in call to SST Reader BeginStep",(allocator *)&local_128);
      IO::ResetVariablesStepSelection(pIVar4,true,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)&MM);
    }
    else {
      SVar13 = OK;
      if (this->m_WriterMarshalMethod == SstMarshalBP5) {
        p_Var7 = SstGetCurMetadata(this->m_Input);
        this->m_CurrentStepMetaData = p_Var7;
        if (this->m_BP5Deserializer == (BP5Deserializer *)0x0) {
          pBVar8 = (BP5Deserializer *)operator_new(0x418);
          adios2::format::BP5Deserializer::BP5Deserializer
                    (pBVar8,this->m_WriterIsRowMajor != 0,(this->Params).IsRowMajor != 0,false,false
                    );
          this->m_BP5Deserializer = pBVar8;
          pBVar8->m_Engine = &this->super_Engine;
        }
        p_Var1 = this->m_Input;
        sVar9 = SstCurrentStep(p_Var1);
        __ptr = SstGetNewMetaMetaData(p_Var1,sVar9);
        if (__ptr != (SstMetaMetaList)0x0) {
          for (psVar14 = &__ptr->IDSize;
              ((_SstMetaMetaBlock *)(psVar14 + -3))->BlockData != (char *)0x0; psVar14 = psVar14 + 4
              ) {
            MM.MetaMetaID = (char *)psVar14[-1];
            MM.MetaMetaIDLen = *psVar14;
            MM.MetaMetaInfoLen = psVar14[-2];
            MM.MetaMetaInfo = ((_SstMetaMetaBlock *)(psVar14 + -3))->BlockData;
            adios2::format::BP5Deserializer::InstallMetaMetaData(this->m_BP5Deserializer,&MM);
          }
        }
        free(__ptr);
        p_Var1 = this->m_Input;
        sVar9 = SstCurrentStep(p_Var1);
        p_Var11 = SstGetAttributeData(p_Var1,sVar9);
        if (p_Var11 != (SstBlock)0x0) {
          for (ppcVar15 = &p_Var11->BlockData; *ppcVar15 != (char *)0x0; ppcVar15 = ppcVar15 + 2) {
            IO::RemoveAllAttributes((this->super_Engine).m_IO);
            adios2::format::BP5Deserializer::InstallAttributeData
                      (this->m_BP5Deserializer,*ppcVar15,((_SstBlock *)(ppcVar15 + -1))->BlockSize,
                       0xffffffffffffffff);
          }
        }
        Engine::RemoveCreatedVars(&this->super_Engine);
        pBVar8 = this->m_BP5Deserializer;
        sVar9 = SstCurrentStep(this->m_Input);
        adios2::format::BP5Deserializer::SetupForStep
                  (pBVar8,sVar9,(long)this->m_CurrentStepMetaData->WriterCohortSize);
        for (sVar9 = 0; (long)sVar9 < (long)this->m_CurrentStepMetaData->WriterCohortSize;
            sVar9 = sVar9 + 1) {
          p_Var3 = this->m_CurrentStepMetaData->WriterMetadata[sVar9];
          adios2::format::BP5Deserializer::InstallMetaData
                    (this->m_BP5Deserializer,p_Var3->block,p_Var3->DataSize,sVar9,0xffffffffffffffff
                    );
        }
        pIVar4 = (this->super_Engine).m_IO;
        std::__cxx11::string::string
                  ((string *)&local_48,"in call to SST Reader BeginStep",(allocator *)&MM);
        IO::ResetVariablesStepSelection(pIVar4,true,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        SVar13 = OK;
      }
    }
  }
  else if (SVar5 == SstEndOfStream) {
    SVar13 = EndOfStream;
  }
  else if (SVar5 == SstTimeout) {
    SVar13 = NotReady;
  }
  else {
    SVar13 = OtherError;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2293);
  return SVar13;
}

Assistant:

StepStatus SstReader::BeginStep(StepMode Mode, const float timeout_sec)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    SstStatusValue result;
    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "SstReader", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    switch (Mode)
    {
    case adios2::StepMode::Append:
    case adios2::StepMode::Update:
        helper::Throw<std::invalid_argument>(
            "Engine", "SstReader", "BeginStep",
            "SstReader::BeginStep inappropriate StepMode specified");
    case adios2::StepMode::Read:
        break;
    }
    RemoveCreatedVars();
    result = SstAdvanceStep(m_Input, timeout_sec);
    if (result == SstEndOfStream)
    {
        return StepStatus::EndOfStream;
    }
    if (result == SstTimeout)
    {
        return StepStatus::NotReady;
    }

    if (result != SstSuccess)
    {
        return StepStatus::OtherError;
    }

    m_BetweenStepPairs = true;

    if (m_WriterMarshalMethod == SstMarshalBP5)
    {
        m_CurrentStepMetaData = SstGetCurMetadata(m_Input);
        if (!m_BP5Deserializer)
        {
            m_BP5Deserializer = new format::BP5Deserializer(m_WriterIsRowMajor, Params.IsRowMajor);
            m_BP5Deserializer->m_Engine = this;
        }
        SstMetaMetaList MMList = SstGetNewMetaMetaData(m_Input, SstCurrentStep(m_Input));
        //      m_BP5Deserializer->StepInit(m_IO.m_Parameters,
        //                                "in call to BP5::BeginStep", "bp5");
        int i = 0;
        while (MMList && MMList[i].BlockData)
        {
            format::BP5Base::MetaMetaInfoBlock MM;
            MM.MetaMetaID = MMList[i].ID;
            MM.MetaMetaIDLen = MMList[i].IDSize;
            MM.MetaMetaInfo = MMList[i].BlockData;
            MM.MetaMetaInfoLen = MMList[i].BlockSize;
            m_BP5Deserializer->InstallMetaMetaData(MM);
            i++;
        }
        free(MMList);

        SstBlock AttributeBlockList = SstGetAttributeData(m_Input, SstCurrentStep(m_Input));
        i = 0;
        while (AttributeBlockList && AttributeBlockList[i].BlockData)
        {
            m_IO.RemoveAllAttributes();
            m_BP5Deserializer->InstallAttributeData(AttributeBlockList[i].BlockData,
                                                    AttributeBlockList[i].BlockSize);
            i++;
        }

        RemoveCreatedVars();
        m_BP5Deserializer->SetupForStep(
            SstCurrentStep(m_Input), static_cast<size_t>(m_CurrentStepMetaData->WriterCohortSize));

        for (int i = 0; i < m_CurrentStepMetaData->WriterCohortSize; i++)
        {
            struct _SstData *tmp = m_CurrentStepMetaData->WriterMetadata[i];
            m_BP5Deserializer->InstallMetaData(tmp->block, tmp->DataSize, i);
        }

        m_IO.ResetVariablesStepSelection(true, "in call to SST Reader BeginStep");
    }
    else if (m_WriterMarshalMethod == SstMarshalBP)
    {
        PERFSTUBS_SCOPED_TIMER("BP Marshaling Case - deserialize and install metadata");
        m_CurrentStepMetaData = SstGetCurMetadata(m_Input);
        // At begin step, you get metadata from the writers.  You need to
        // use this for two things: First, you need to create the
        // appropriate variables on the reader side to represent what has
        // been written.  Second, you must keep the metadata around (or a
        // summary structure that represents its contents), so that you can
        // look at it in DoGets* and issue the appropriate
        // ReadRemoteMemory() requests to the writers.  This is because the
        // full data isn't here yet.  We don't know what we'll need on this
        // reader, and we don't want to send *all* data from *all* writers
        // here because that's not scalable.  So, we'll fetch what we need.
        // This is one of the core ideas of SST.

        //   Further clarification:
        //   m_CurrentStepMetaData is a struct like this:

        //     struct _SstFullMetadata
        //     {
        //       int WriterCohortSize;
        //       struct _SstData **WriterMetadata;
        //       void **DP_TimestepInfo;
        //     };

        //   WriterMetadata has an element for each Writer rank
        //   (WriterCohortSize).  WriterMetadata[i] is a pointer to (a copy
        //   of) the SstData block of Metadata that was passed to
        //   SstProvideTimestep by Writer rank i.  SST has simply gathered
        //   them and provided them to each reader.  The DP_TimestepInfo is
        //   for the DataPlane, and DP_TimestepInfo[i] should be passed as
        //   the DP_TimestepInfo parameter when a SstReadRemoteMemory call
        //   is made requesting rank i.  (This may contain MR keys, or
        //   anything else that the Data Plane needs for efficient RDMA on
        //   whatever transport it is using.  But it is opaque to the Engine
        //   (and to the control plane).)

        m_BP3Deserializer = new format::BP3Deserializer(m_Comm);
        m_BP3Deserializer->Init(m_IO.m_Parameters, "in call to BP3::Open for reading", "sst");

        m_BP3Deserializer->m_Metadata.Resize((*m_CurrentStepMetaData->WriterMetadata)->DataSize,
                                             "in SST Streaming Listener");

        std::memcpy(m_BP3Deserializer->m_Metadata.m_Buffer.data(),
                    (*m_CurrentStepMetaData->WriterMetadata)->block,
                    (*m_CurrentStepMetaData->WriterMetadata)->DataSize);

        RemoveCreatedVars();
        m_BP3Deserializer->ParseMetadata(m_BP3Deserializer->m_Metadata, *this);
        m_IO.ResetVariablesStepSelection(true, "in call to SST Reader BeginStep");
    }
    else if (m_WriterMarshalMethod == SstMarshalFFS)
    {
        // For FFS-based marshaling, SstAdvanceStep takes care of installing
        // the metadata, creating variables using the varFFScallback and
        // arrayFFScallback, so there's nothing to be done now.  This
        // comment is just for clarification.
    }
    else
    {
        // unknown marshaling method, shouldn't happen
    }

    return StepStatus::OK;
}